

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O1

void __thiscall
Opcode::AABBTreeCollider::_CollideTriBox(AABBTreeCollider *this,AABBQuantizedNoLeafNode *b)

{
  udword *puVar1;
  Point *v0;
  Point *v2;
  udword uVar2;
  AABBQuantizedNoLeafNode *b_00;
  MeshInterface *pMVar3;
  IndexedTriangle *pIVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  udword q;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  Point *pPVar10;
  Point *pPVar11;
  udword uVar12;
  ulong uVar13;
  Point *pPVar14;
  ulong uVar15;
  Point *pPVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  Point vmin;
  Point eb;
  Point normal;
  Point vmax;
  Point local_154;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [16];
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_6c [6];
  float local_54 [3];
  undefined1 local_48 [16];
  
  do {
    fVar20 = (float)(int)(b->mAABB).mCenter[0] * (this->mCenterCoeff1).x;
    fVar29 = (float)(int)(b->mAABB).mCenter[1] * (this->mCenterCoeff1).y;
    fVar26 = (float)(int)(b->mAABB).mCenter[2] * (this->mCenterCoeff1).z;
    local_6c[0] = (float)(b->mAABB).mExtents[0] * (this->mExtentsCoeff1).x;
    local_6c[1] = (float)(b->mAABB).mExtents[1] * (this->mExtentsCoeff1).y;
    local_6c[2] = (float)(b->mAABB).mExtents[2] * (this->mExtentsCoeff1).z;
    this->mNbBVPrimTests = this->mNbBVPrimTests + 1;
    fVar17 = this->mLeafVerts[0].x;
    fVar25 = this->mLeafVerts[1].x;
    fVar24 = fVar17 - fVar20;
    fVar18 = fVar25 - fVar20;
    fVar19 = this->mLeafVerts[2].x;
    fVar20 = fVar19 - fVar20;
    fVar30 = fVar24;
    if (fVar18 <= fVar24) {
      fVar30 = fVar18;
    }
    if (fVar20 <= fVar30) {
      fVar30 = fVar20;
    }
    if (local_6c[0] < fVar30) {
      return;
    }
    fVar30 = fVar18;
    if (fVar18 <= fVar24) {
      fVar30 = fVar24;
    }
    fVar23 = fVar20;
    if (fVar20 <= fVar30) {
      fVar23 = fVar30;
    }
    if (fVar23 < -local_6c[0]) {
      return;
    }
    fVar32 = this->mLeafVerts[0].y - fVar29;
    fVar23 = this->mLeafVerts[1].y - fVar29;
    fVar29 = this->mLeafVerts[2].y - fVar29;
    fVar30 = fVar32;
    if (fVar23 <= fVar32) {
      fVar30 = fVar23;
    }
    if (fVar29 <= fVar30) {
      fVar30 = fVar29;
    }
    if (local_6c[1] < fVar30) {
      return;
    }
    fVar30 = fVar23;
    if (fVar23 <= fVar32) {
      fVar30 = fVar32;
    }
    fVar33 = fVar29;
    if (fVar29 <= fVar30) {
      fVar33 = fVar30;
    }
    if (fVar33 < -local_6c[1]) {
      return;
    }
    fVar33 = this->mLeafVerts[0].z - fVar26;
    fVar38 = this->mLeafVerts[1].z - fVar26;
    fVar26 = this->mLeafVerts[2].z - fVar26;
    fVar30 = fVar33;
    if (fVar38 <= fVar33) {
      fVar30 = fVar38;
    }
    if (fVar26 <= fVar30) {
      fVar30 = fVar26;
    }
    if (local_6c[2] < fVar30) {
      return;
    }
    fVar30 = fVar38;
    if (fVar38 <= fVar33) {
      fVar30 = fVar33;
    }
    fVar35 = fVar26;
    if (fVar26 <= fVar30) {
      fVar35 = fVar30;
    }
    if (fVar35 < -local_6c[2]) {
      return;
    }
    v0 = this->mLeafVerts;
    pPVar11 = this->mLeafVerts + 1;
    v2 = this->mLeafVerts + 2;
    fVar30 = fVar18 - fVar24;
    fVar31 = fVar23 - fVar32;
    fVar21 = fVar38 - fVar33;
    fVar34 = fVar20 - fVar18;
    local_d8 = ZEXT416((uint)fVar34);
    fVar35 = fVar29 - fVar23;
    local_98._0_4_ = fVar38;
    fVar27 = fVar26 - fVar38;
    local_108._0_4_ = -fVar21;
    local_108._4_4_ = 0x80000000;
    local_108._8_4_ = 0x80000000;
    local_108._12_4_ = 0x80000000;
    local_a8 = fVar31 * fVar27 - fVar35 * fVar21;
    local_118._0_4_ = -fVar30;
    local_118._4_4_ = 0x80000000;
    local_118._8_4_ = 0x80000000;
    local_118._12_4_ = 0x80000000;
    local_128 = ZEXT416((uint)fVar27);
    fVar28 = fVar21 * fVar34 - fVar27 * fVar30;
    local_88 = -fVar31;
    uStack_80 = 0x80000000;
    uStack_7c = 0x80000000;
    uStack_84 = 0x80000000;
    local_b8 = fVar30 * fVar35 - fVar34 * fVar31;
    local_6c[3] = local_a8;
    local_6c[4] = fVar28;
    local_6c[5] = local_b8;
    lVar8 = 0;
    do {
      fVar36 = local_6c[lVar8];
      if (local_6c[lVar8 + 3] <= 0.0) {
        (&local_154.x)[lVar8] = fVar36;
        fVar36 = -fVar36;
      }
      else {
        (&local_154.x)[lVar8] = -fVar36;
      }
      local_6c[lVar8 + 6] = fVar36;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    fVar36 = (-local_a8 * fVar24 - fVar32 * fVar28) - local_b8 * fVar33;
    if (0.0 < local_154.z * local_b8 + local_154.x * local_a8 + local_154.y * fVar28 + fVar36) {
      return;
    }
    if (fVar36 + local_b8 * local_54[2] + local_a8 * local_54[0] + fVar28 * local_54[1] < 0.0) {
      return;
    }
    if (this->mFullPrimBoxTest == true) {
      local_a8 = ABS(fVar31);
      fVar22 = ABS(fVar21);
      fVar28 = fVar21 * fVar32 + fVar33 * local_88;
      fVar21 = fVar21 * fVar29 + local_88 * fVar26;
      fVar36 = fVar21;
      if (fVar28 <= fVar21) {
        fVar36 = fVar28;
      }
      fVar37 = fVar22 * local_6c[1] + local_6c[2] * local_a8;
      if (fVar37 < fVar36) {
        return;
      }
      if (fVar28 <= fVar21) {
        fVar28 = fVar21;
      }
      if (fVar28 < -fVar37) {
        return;
      }
      local_b8 = ABS(fVar30);
      fVar28 = fVar30 * fVar33 + fVar24 * (float)local_108._0_4_;
      fVar36 = fVar30 * fVar26 + (float)local_108._0_4_ * fVar20;
      fVar30 = fVar36;
      if (fVar28 <= fVar36) {
        fVar30 = fVar28;
      }
      fVar22 = fVar22 * local_6c[0] + local_6c[2] * local_b8;
      if (fVar22 < fVar30) {
        return;
      }
      if (fVar28 <= fVar36) {
        fVar28 = fVar36;
      }
      if (fVar28 < -fVar22) {
        return;
      }
      fVar30 = fVar31 * fVar18 + fVar23 * (float)local_118._0_4_;
      fVar31 = fVar31 * fVar20 + (float)local_118._0_4_ * fVar29;
      fVar28 = fVar31;
      if (fVar30 <= fVar31) {
        fVar28 = fVar30;
      }
      fVar36 = local_a8 * local_6c[0] + local_b8 * local_6c[1];
      if (fVar36 < fVar28) {
        return;
      }
      if (fVar30 <= fVar31) {
        fVar30 = fVar31;
      }
      if (fVar30 < -fVar36) {
        return;
      }
      fVar36 = ABS(fVar35);
      fVar28 = ABS(fVar27);
      fVar31 = fVar27 * fVar32 - fVar33 * fVar35;
      fVar22 = fVar27 * fVar29 - fVar26 * fVar35;
      fVar30 = fVar22;
      if (fVar31 <= fVar22) {
        fVar30 = fVar31;
      }
      fVar37 = fVar28 * local_6c[1] + local_6c[2] * fVar36;
      if (fVar37 < fVar30) {
        return;
      }
      if (fVar31 <= fVar22) {
        fVar31 = fVar22;
      }
      if (fVar31 < -fVar37) {
        return;
      }
      fVar31 = fVar34 * fVar33 - fVar24 * fVar27;
      fVar26 = fVar26 * fVar34 - fVar27 * fVar20;
      fVar30 = fVar26;
      if (fVar31 <= fVar26) {
        fVar30 = fVar31;
      }
      fVar27 = fVar28 * local_6c[0] + local_6c[2] * ABS(fVar34);
      if (fVar27 < fVar30) {
        return;
      }
      if (fVar31 <= fVar26) {
        fVar31 = fVar26;
      }
      if (fVar31 < -fVar27) {
        return;
      }
      fVar30 = fVar35 * fVar24 - fVar32 * fVar34;
      fVar35 = fVar35 * fVar18 - fVar34 * fVar23;
      fVar26 = fVar35;
      if (fVar30 <= fVar35) {
        fVar26 = fVar30;
      }
      fVar27 = fVar36 * local_6c[0] + ABS(fVar34) * local_6c[1];
      if (fVar27 < fVar26) {
        return;
      }
      if (fVar30 <= fVar35) {
        fVar30 = fVar35;
      }
      if (fVar30 < -fVar27) {
        return;
      }
      fVar30 = this->mLeafVerts[0].y - this->mLeafVerts[2].y;
      fVar31 = this->mLeafVerts[0].z - this->mLeafVerts[2].z;
      fVar26 = fVar32 * fVar31 - fVar33 * fVar30;
      fVar27 = fVar31 * fVar23 - fVar38 * fVar30;
      fVar32 = fVar27;
      if (fVar26 <= fVar27) {
        fVar32 = fVar26;
      }
      fVar34 = ABS(fVar31) * local_6c[1] + local_6c[2] * ABS(fVar30);
      if (fVar34 < fVar32) {
        return;
      }
      if (fVar26 <= fVar27) {
        fVar26 = fVar27;
      }
      if (fVar26 < -fVar34) {
        return;
      }
      fVar27 = fVar17 - fVar19;
      fVar26 = fVar33 * fVar27 - fVar24 * fVar31;
      fVar32 = fVar38 * fVar27 - fVar31 * fVar18;
      fVar24 = fVar32;
      if (fVar26 <= fVar32) {
        fVar24 = fVar26;
      }
      fVar33 = ABS(fVar31) * local_6c[0] + local_6c[2] * ABS(fVar27);
      if (fVar33 < fVar24) {
        return;
      }
      if (fVar26 <= fVar32) {
        fVar26 = fVar32;
      }
      if (fVar26 < -fVar33) {
        return;
      }
      fVar18 = fVar18 * fVar30 - fVar23 * fVar27;
      fVar29 = fVar20 * fVar30 - fVar29 * fVar27;
      fVar20 = fVar29;
      if (fVar18 <= fVar29) {
        fVar20 = fVar18;
      }
      fVar24 = ABS(fVar30) * local_6c[0] + local_6c[1] * ABS(fVar27);
      if (fVar24 < fVar20) {
        return;
      }
      if (fVar18 <= fVar29) {
        fVar18 = fVar29;
      }
      if (fVar18 < -fVar24) {
        return;
      }
    }
    uStack_ac = 0;
    uStack_b0 = 0;
    uStack_b4 = 0;
    local_f8 = ZEXT416((uint)fVar28);
    uStack_9c = 0;
    uStack_a0 = 0;
    uStack_a4 = 0;
    local_c8 = ZEXT416((uint)fVar21);
    local_e8 = ZEXT416((uint)fVar35);
    local_138 = ZEXT416((uint)fVar30);
    local_148 = ZEXT416((uint)fVar31);
    b_00 = (AABBQuantizedNoLeafNode *)b->mPosData;
    local_148._0_8_ = pPVar11;
    if (((ulong)b_00 & 1) == 0) {
      _CollideTriBox(this,b_00);
    }
    else {
      pMVar3 = this->mIMesh1;
      uVar12 = (udword)((ulong)b_00 >> 1);
      uVar9 = (ulong)(pMVar3->mTriStride * uVar12);
      pIVar4 = pMVar3->mTris;
      uVar2 = pMVar3->mVertexStride;
      uVar13 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar9) * uVar2);
      uVar15 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar9 + 4) * uVar2);
      uVar9 = (ulong)(uVar2 * *(int *)((long)pIVar4->mVRef + uVar9 + 8));
      pPVar10 = pMVar3->mVerts;
      this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
      fVar30 = this->mLeafVerts[1].y;
      fVar18 = this->mLeafVerts[0].y;
      local_f8 = ZEXT416((uint)fVar30);
      fVar20 = this->mLeafVerts[1].z;
      fVar29 = this->mLeafVerts[0].z;
      fVar23 = fVar20 - fVar29;
      fVar24 = this->mLeafVerts[2].y;
      local_d8 = ZEXT416((uint)fVar24);
      fVar26 = this->mLeafVerts[2].z;
      local_148._8_8_ = 0;
      local_154.x = (fVar30 - fVar18) * (fVar26 - fVar29) - (fVar24 - fVar18) * fVar23;
      local_154.y = fVar23 * (fVar19 - fVar17) - (fVar26 - fVar29) * (fVar25 - fVar17);
      local_154.z = (fVar24 - fVar18) * (fVar25 - fVar17) - (fVar19 - fVar17) * (fVar30 - fVar18);
      local_88 = -local_154.x;
      uStack_84 = 0x80000000;
      uStack_80 = 0x80000000;
      uStack_7c = 0x80000000;
      local_138 = ZEXT416((uint)fVar29);
      fVar31 = (local_88 * fVar17 - fVar18 * local_154.y) - local_154.z * fVar29;
      local_a8 = *(float *)((long)&pPVar10->x + uVar13);
      fVar23 = *(float *)((long)&pPVar10->y + uVar13);
      local_e8 = ZEXT416((uint)fVar23);
      local_b8 = *(float *)((long)&pPVar10->z + uVar13);
      fVar32 = *(float *)((long)&pPVar10->y + uVar15);
      local_c8 = ZEXT416((uint)fVar32);
      fVar33 = *(float *)((long)&pPVar10->x + uVar15);
      fVar38 = *(float *)((long)&pPVar10->z + uVar15);
      fVar35 = *(float *)((long)&pPVar10->y + uVar9);
      fVar21 = *(float *)((long)&pPVar10->x + uVar9);
      fVar28 = *(float *)((long)&pPVar10->z + uVar9);
      fVar36 = local_154.z * local_b8 + local_154.x * local_a8 + local_154.y * fVar23 + fVar31;
      fVar27 = local_154.z * fVar38 + local_154.x * fVar33 + local_154.y * fVar32 + fVar31;
      fVar31 = local_154.z * fVar28 + local_154.x * fVar21 + local_154.y * fVar35 + fVar31;
      fVar36 = (float)(~-(uint)(ABS(fVar36) < 1e-06) & (uint)fVar36);
      fVar27 = (float)(~-(uint)(ABS(fVar27) < 1e-06) & (uint)fVar27);
      fVar31 = (float)(~-(uint)(ABS(fVar31) < 1e-06) & (uint)fVar31);
      fVar22 = fVar36 * fVar27;
      fVar34 = fVar36 * fVar31;
      if ((fVar22 <= 0.0) || (uVar7 = 0, uVar6 = 0, fVar34 <= 0.0)) {
        local_128 = ZEXT416((uint)local_154.y);
        local_118 = ZEXT416((uint)local_154.x);
        local_48 = ZEXT416((uint)fVar34);
        local_98 = ZEXT416((uint)fVar22);
        local_108 = ZEXT416((uint)fVar31);
        fVar38 = fVar38 - local_b8;
        fVar35 = fVar35 - fVar23;
        fVar28 = fVar28 - local_b8;
        fVar37 = (fVar32 - fVar23) * fVar28 - fVar35 * fVar38;
        fVar33 = fVar33 - local_a8;
        fVar21 = fVar21 - local_a8;
        fVar38 = fVar38 * fVar21 - fVar28 * fVar33;
        fVar32 = fVar35 * fVar33 - fVar21 * (fVar32 - fVar23);
        fVar23 = (-fVar37 * local_a8 - fVar23 * fVar38) - local_b8 * fVar32;
        fVar17 = fVar29 * fVar32 + fVar17 * fVar37 + fVar18 * fVar38 + fVar23;
        fVar25 = fVar20 * fVar32 + fVar25 * fVar37 + fVar30 * fVar38 + fVar23;
        fVar23 = fVar26 * fVar32 + fVar19 * fVar37 + fVar24 * fVar38 + fVar23;
        fVar17 = (float)(~-(uint)(ABS(fVar17) < 1e-06) & (uint)fVar17);
        fVar25 = (float)(~-(uint)(ABS(fVar25) < 1e-06) & (uint)fVar25);
        fVar23 = (float)(~-(uint)(ABS(fVar23) < 1e-06) & (uint)fVar23);
        uVar6 = local_148._8_8_;
        if ((fVar17 * fVar25 <= 0.0) || (uVar7 = 0, fVar17 * fVar23 <= 0.0)) {
          pPVar14 = (Point *)((long)&pPVar10->x + uVar13);
          pPVar16 = (Point *)((long)&pPVar10->x + uVar15);
          pPVar10 = (Point *)((long)&pPVar10->x + uVar9);
          fVar30 = ABS(local_154.y * fVar32 + -local_154.z * fVar38);
          fVar18 = ABS(local_154.z * fVar37 + local_88 * fVar32);
          fVar19 = fVar18;
          if (fVar18 <= fVar30) {
            fVar19 = fVar30;
          }
          uVar7 = 2;
          if (ABS(local_154.x * fVar38 + -local_154.y * fVar37) <= fVar19) {
            uVar7 = (uint)(fVar30 < fVar18);
          }
          uVar9 = (ulong)(uVar7 << 2);
          fVar19 = *(float *)((long)&v0->x + uVar9);
          fVar30 = *(float *)((long)&pPVar11->x + uVar9);
          fVar18 = *(float *)((long)&v2->x + uVar9);
          fVar20 = *(float *)((long)&pPVar14->x + uVar9);
          fVar29 = *(float *)((long)&pPVar16->x + uVar9);
          fVar24 = *(float *)((long)&pPVar10->x + uVar9);
          if (fVar17 * fVar25 <= 0.0) {
            if (0.0 < fVar17 * fVar23) {
LAB_001bc1e3:
              fVar33 = (fVar19 - fVar30) * fVar25;
              fVar32 = (fVar18 - fVar30) * fVar25;
              fVar38 = fVar25 - fVar17;
              fVar23 = fVar25 - fVar23;
              fVar19 = fVar30;
              goto LAB_001bc235;
            }
            if (((fVar17 != 0.0) || (NAN(fVar17))) || (0.0 < fVar25 * fVar23)) {
              fVar33 = (fVar30 - fVar19) * fVar17;
              fVar32 = (fVar18 - fVar19) * fVar17;
              fVar38 = fVar17 - fVar25;
              fVar23 = fVar17 - fVar23;
              goto LAB_001bc235;
            }
            if ((fVar25 != 0.0) || (NAN(fVar25))) goto LAB_001bc1e3;
            if ((fVar23 != 0.0) || (NAN(fVar23))) goto LAB_001bc187;
LAB_001bcba5:
            local_148 = ZEXT416((uint)fVar26);
            uVar7 = CoplanarTriTri(&local_154,v0,pPVar11,v2,pPVar14,pPVar16,pPVar10);
            uVar6 = local_148._8_8_;
          }
          else {
LAB_001bc187:
            fVar33 = (fVar19 - fVar18) * fVar23;
            fVar32 = (fVar30 - fVar18) * fVar23;
            fVar38 = fVar23 - fVar17;
            fVar23 = fVar23 - fVar25;
            fVar19 = fVar18;
LAB_001bc235:
            if (fVar22 <= 0.0) {
              if (0.0 < fVar34) {
LAB_001bc2bb:
                fVar17 = (fVar20 - fVar29) * fVar27;
                fVar25 = (fVar24 - fVar29) * fVar27;
                fVar30 = fVar27 - fVar31;
                goto LAB_001bc2ea;
              }
              if (((fVar36 == 0.0) && (!NAN(fVar36))) && (fVar27 * fVar31 <= 0.0)) {
                if ((fVar27 == 0.0) && (!NAN(fVar27))) {
                  if ((fVar31 == 0.0) && (!NAN(fVar31))) goto LAB_001bcba5;
                  goto LAB_001bc245;
                }
                goto LAB_001bc2bb;
              }
              fVar17 = (fVar29 - fVar20) * fVar36;
              fVar25 = (fVar24 - fVar20) * fVar36;
              fVar27 = fVar36 - fVar27;
              fVar30 = fVar36 - fVar31;
            }
            else {
LAB_001bc245:
              fVar17 = (fVar20 - fVar24) * fVar31;
              fVar25 = (fVar29 - fVar24) * fVar31;
              fVar30 = fVar31 - fVar27;
              fVar29 = fVar24;
              fVar27 = fVar31;
LAB_001bc2ea:
              fVar27 = fVar27 - fVar36;
              fVar20 = fVar29;
            }
            fVar24 = fVar38 * fVar23;
            fVar29 = fVar27 * fVar30;
            fVar19 = fVar19 * fVar24 * fVar29;
            fVar18 = fVar33 * fVar23 * fVar29 + fVar19;
            fVar19 = fVar29 * fVar32 * fVar38 + fVar19;
            fVar20 = fVar24 * fVar29 * fVar20;
            fVar30 = fVar17 * fVar24 * fVar30 + fVar20;
            fVar20 = fVar24 * fVar25 * fVar27 + fVar20;
            fVar17 = fVar19;
            if (fVar18 <= fVar19) {
              fVar17 = fVar18;
              fVar18 = fVar19;
            }
            fVar25 = fVar30;
            if (fVar30 <= fVar20) {
              fVar25 = fVar20;
            }
            if (fVar30 <= fVar20) {
              fVar20 = fVar30;
            }
            uVar7 = -(uint)(fVar20 <= fVar18 && fVar17 <= fVar25) & 1;
          }
        }
      }
      local_148._8_8_ = uVar6;
      if (uVar7 != 0) {
        uVar2 = this->mLeafIndex;
        if ((this->mPairs).mCurNbEntries == (this->mPairs).mMaxNbEntries) {
          IceCore::Container::Resize(&this->mPairs,1);
        }
        uVar7 = (this->mPairs).mCurNbEntries;
        (this->mPairs).mCurNbEntries = uVar7 + 1;
        (this->mPairs).mEntries[uVar7] = uVar2;
        if ((this->mPairs).mCurNbEntries == (this->mPairs).mMaxNbEntries) {
          IceCore::Container::Resize(&this->mPairs,1);
        }
        uVar7 = (this->mPairs).mCurNbEntries;
        (this->mPairs).mCurNbEntries = uVar7 + 1;
        (this->mPairs).mEntries[uVar7] = uVar12;
        puVar1 = &(this->super_Collider).mFlags;
        *(byte *)puVar1 = (byte)*puVar1 | 4;
      }
    }
    if ((~(this->super_Collider).mFlags & 5) == 0) {
      return;
    }
    b = (AABBQuantizedNoLeafNode *)b->mNegData;
  } while (((ulong)b & 1) == 0);
  pMVar3 = this->mIMesh1;
  uVar12 = (udword)((ulong)b >> 1);
  uVar9 = (ulong)(pMVar3->mTriStride * uVar12);
  pIVar4 = pMVar3->mTris;
  uVar2 = pMVar3->mVertexStride;
  uVar13 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar9) * uVar2);
  uVar15 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar9 + 4) * uVar2);
  uVar9 = (ulong)(uVar2 * *(int *)((long)pIVar4->mVRef + uVar9 + 8));
  pPVar11 = pMVar3->mVerts;
  this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
  fVar17 = this->mLeafVerts[1].x;
  local_a8 = this->mLeafVerts[0].x;
  local_d8._0_4_ = fVar17;
  fVar25 = this->mLeafVerts[1].y;
  local_b8 = this->mLeafVerts[0].y;
  local_e8._0_4_ = fVar25;
  fVar19 = this->mLeafVerts[1].z;
  fVar30 = this->mLeafVerts[0].z;
  fVar24 = fVar19 - fVar30;
  fVar18 = this->mLeafVerts[2].x;
  local_f8._0_4_ = fVar18;
  fVar20 = this->mLeafVerts[2].y;
  fVar26 = fVar20 - local_b8;
  fVar29 = this->mLeafVerts[2].z;
  auVar5 = ZEXT416((uint)fVar29);
  local_154.x = (fVar25 - local_b8) * (fVar29 - fVar30) - fVar26 * fVar24;
  local_154.y = fVar24 * (fVar18 - local_a8) - (fVar29 - fVar30) * (fVar17 - local_a8);
  local_154.z = fVar26 * (fVar17 - local_a8) - (fVar18 - local_a8) * (fVar25 - local_b8);
  local_108._0_4_ = -local_154.x;
  local_108._4_4_ = 0x80000000;
  local_108._8_4_ = 0x80000000;
  local_108._12_4_ = 0x80000000;
  local_138 = ZEXT416((uint)fVar30);
  fVar28 = ((float)local_108._0_4_ * local_a8 - local_b8 * local_154.y) - local_154.z * fVar30;
  fVar24 = *(float *)((long)&pPVar11->y + uVar13);
  local_c8._0_4_ = fVar24;
  local_88 = *(float *)((long)&pPVar11->x + uVar13);
  fVar26 = *(float *)((long)&pPVar11->z + uVar13);
  fVar23 = *(float *)((long)&pPVar11->y + uVar15);
  fVar32 = *(float *)((long)&pPVar11->x + uVar15);
  fVar33 = *(float *)((long)&pPVar11->z + uVar15);
  fVar38 = *(float *)((long)&pPVar11->y + uVar9);
  fVar35 = *(float *)((long)&pPVar11->x + uVar9);
  fVar21 = *(float *)((long)&pPVar11->z + uVar9);
  fVar34 = local_154.z * fVar26 + local_154.x * local_88 + local_154.y * fVar24 + fVar28;
  fVar27 = local_154.z * fVar33 + local_154.x * fVar32 + local_154.y * fVar23 + fVar28;
  fVar28 = local_154.z * fVar21 + local_154.x * fVar35 + local_154.y * fVar38 + fVar28;
  fVar34 = (float)(~-(uint)(ABS(fVar34) < 1e-06) & (uint)fVar34);
  fVar27 = (float)(~-(uint)(ABS(fVar27) < 1e-06) & (uint)fVar27);
  fVar28 = (float)(~-(uint)(ABS(fVar28) < 1e-06) & (uint)fVar28);
  fVar36 = fVar34 * fVar27;
  fVar31 = fVar34 * fVar28;
  if ((0.0 < fVar36) && (uVar7 = 0, 0.0 < fVar31)) goto LAB_001bcb11;
  local_98 = ZEXT416((uint)fVar36);
  local_48 = ZEXT416((uint)fVar31);
  local_128 = ZEXT416((uint)fVar28);
  local_118 = ZEXT416((uint)fVar27);
  fVar23 = fVar23 - fVar24;
  fVar33 = fVar33 - fVar26;
  fVar38 = fVar38 - fVar24;
  fVar21 = fVar21 - fVar26;
  fVar22 = fVar23 * fVar21 - fVar38 * fVar33;
  fVar32 = fVar32 - local_88;
  fVar35 = fVar35 - local_88;
  fVar33 = fVar33 * fVar35 - fVar21 * fVar32;
  fVar23 = fVar38 * fVar32 - fVar35 * fVar23;
  fVar24 = (-fVar22 * local_88 - fVar24 * fVar33) - fVar26 * fVar23;
  fVar30 = fVar30 * fVar23 + local_a8 * fVar22 + local_b8 * fVar33 + fVar24;
  fVar17 = fVar19 * fVar23 + fVar17 * fVar22 + fVar25 * fVar33 + fVar24;
  fVar24 = fVar29 * fVar23 + fVar18 * fVar22 + fVar20 * fVar33 + fVar24;
  fVar30 = (float)(~-(uint)(ABS(fVar30) < 1e-06) & (uint)fVar30);
  fVar17 = (float)(~-(uint)(ABS(fVar17) < 1e-06) & (uint)fVar17);
  fVar24 = (float)(~-(uint)(ABS(fVar24) < 1e-06) & (uint)fVar24);
  if ((0.0 < fVar30 * fVar17) && (uVar7 = 0, 0.0 < fVar30 * fVar24)) goto LAB_001bcb11;
  pPVar10 = (Point *)((long)&pPVar11->x + uVar13);
  pPVar14 = (Point *)((long)&pPVar11->x + uVar15);
  pPVar11 = (Point *)((long)&pPVar11->x + uVar9);
  fVar19 = ABS(local_154.y * fVar23 + -local_154.z * fVar33);
  fVar18 = ABS(local_154.z * fVar22 + (float)local_108._0_4_ * fVar23);
  fVar25 = fVar18;
  if (fVar18 <= fVar19) {
    fVar25 = fVar19;
  }
  uVar7 = 2;
  if (ABS(local_154.x * fVar33 + -local_154.y * fVar22) <= fVar25) {
    uVar7 = (uint)(fVar19 < fVar18);
  }
  uVar9 = (ulong)(uVar7 << 2);
  fVar25 = *(float *)((long)&v0->x + uVar9);
  fVar19 = *(float *)((long)&((Point *)local_148._0_8_)->x + uVar9);
  fVar18 = *(float *)((long)&v2->x + uVar9);
  fVar20 = *(float *)((long)&pPVar10->x + uVar9);
  fVar29 = *(float *)((long)&pPVar14->x + uVar9);
  fVar26 = *(float *)((long)&pPVar11->x + uVar9);
  if (fVar30 * fVar17 <= 0.0) {
    if (0.0 < fVar30 * fVar24) {
LAB_001bc933:
      fVar32 = (fVar25 - fVar19) * fVar17;
      fVar23 = (fVar18 - fVar19) * fVar17;
      fVar33 = fVar17 - fVar30;
      fVar24 = fVar17 - fVar24;
      fVar25 = fVar19;
      goto LAB_001bc9b2;
    }
    if (((fVar30 != 0.0) || (NAN(fVar30))) || (0.0 < fVar17 * fVar24)) {
      fVar32 = (fVar19 - fVar25) * fVar30;
      fVar23 = (fVar18 - fVar25) * fVar30;
      fVar33 = fVar30 - fVar17;
      fVar24 = fVar30 - fVar24;
      goto LAB_001bc9b2;
    }
    if ((fVar17 != 0.0) || (NAN(fVar17))) goto LAB_001bc933;
    if ((fVar24 != 0.0) || (NAN(fVar24))) goto LAB_001bc8d2;
LAB_001bcbe6:
    pPVar16 = (Point *)local_148._0_8_;
    local_148 = auVar5;
    uVar7 = CoplanarTriTri(&local_154,v0,pPVar16,v2,pPVar10,pPVar14,pPVar11);
    auVar5 = local_148;
    goto LAB_001bcb11;
  }
LAB_001bc8d2:
  fVar32 = (fVar25 - fVar18) * fVar24;
  fVar23 = (fVar19 - fVar18) * fVar24;
  fVar33 = fVar24 - fVar30;
  fVar24 = fVar24 - fVar17;
  fVar25 = fVar18;
LAB_001bc9b2:
  if (fVar36 <= 0.0) {
    if (fVar31 <= 0.0) {
      if (((fVar34 != 0.0) || (NAN(fVar34))) || (0.0 < fVar27 * fVar28)) {
        fVar30 = (fVar29 - fVar20) * fVar34;
        fVar19 = (fVar26 - fVar20) * fVar34;
        fVar17 = fVar34 - fVar27;
        fVar28 = fVar34 - fVar28;
        goto LAB_001bca8c;
      }
      if ((fVar27 == 0.0) && (!NAN(fVar27))) {
        if ((fVar28 == 0.0) && (!NAN(fVar28))) goto LAB_001bcbe6;
        goto LAB_001bc9c2;
      }
    }
    fVar30 = (fVar20 - fVar29) * fVar27;
    fVar19 = (fVar26 - fVar29) * fVar27;
    fVar17 = fVar27 - fVar34;
    fVar28 = fVar27 - fVar28;
    fVar20 = fVar29;
  }
  else {
LAB_001bc9c2:
    fVar30 = (fVar20 - fVar26) * fVar28;
    fVar19 = (fVar29 - fVar26) * fVar28;
    fVar17 = fVar28 - fVar34;
    fVar28 = fVar28 - fVar27;
    fVar20 = fVar26;
  }
LAB_001bca8c:
  fVar26 = fVar33 * fVar24;
  fVar29 = fVar17 * fVar28;
  fVar25 = fVar25 * fVar26 * fVar29;
  fVar18 = fVar32 * fVar24 * fVar29 + fVar25;
  fVar25 = fVar29 * fVar23 * fVar33 + fVar25;
  fVar20 = fVar26 * fVar29 * fVar20;
  fVar30 = fVar30 * fVar26 * fVar28 + fVar20;
  fVar20 = fVar26 * fVar19 * fVar17 + fVar20;
  fVar17 = fVar25;
  if (fVar18 <= fVar25) {
    fVar17 = fVar18;
    fVar18 = fVar25;
  }
  fVar25 = fVar30;
  if (fVar30 <= fVar20) {
    fVar25 = fVar20;
  }
  if (fVar30 <= fVar20) {
    fVar20 = fVar30;
  }
  uVar7 = -(uint)(fVar20 <= fVar18 && fVar17 <= fVar25) & 1;
LAB_001bcb11:
  local_148 = auVar5;
  if (uVar7 != 0) {
    uVar2 = this->mLeafIndex;
    if ((this->mPairs).mCurNbEntries == (this->mPairs).mMaxNbEntries) {
      IceCore::Container::Resize(&this->mPairs,1);
    }
    uVar7 = (this->mPairs).mCurNbEntries;
    (this->mPairs).mCurNbEntries = uVar7 + 1;
    (this->mPairs).mEntries[uVar7] = uVar2;
    if ((this->mPairs).mCurNbEntries == (this->mPairs).mMaxNbEntries) {
      IceCore::Container::Resize(&this->mPairs,1);
    }
    uVar7 = (this->mPairs).mCurNbEntries;
    (this->mPairs).mCurNbEntries = uVar7 + 1;
    (this->mPairs).mEntries[uVar7] = uVar12;
    puVar1 = &(this->super_Collider).mFlags;
    *(byte *)puVar1 = (byte)*puVar1 | 4;
  }
  return;
}

Assistant:

void AABBTreeCollider::_CollideTriBox(const AABBQuantizedNoLeafNode* b)
{
	// Dequantize box
	const QuantizedAABB* bb = &b->mAABB;
	const Point Pb(float(bb->mCenter[0]) * mCenterCoeff1.x, float(bb->mCenter[1]) * mCenterCoeff1.y, float(bb->mCenter[2]) * mCenterCoeff1.z);
	const Point eb(float(bb->mExtents[0]) * mExtentsCoeff1.x, float(bb->mExtents[1]) * mExtentsCoeff1.y, float(bb->mExtents[2]) * mExtentsCoeff1.z);

	// Perform triangle-box overlap test
	if(!TriBoxOverlap(Pb, eb))	return;

	if(b->HasPosLeaf())	PrimTestTriIndex(b->GetPosPrimitive());
	else				_CollideTriBox(b->GetPos());

	if(ContactFound()) return;

	if(b->HasNegLeaf())	PrimTestTriIndex(b->GetNegPrimitive());
	else				_CollideTriBox(b->GetNeg());
}